

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitSectionComment
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst,
          bool *inserted_decoration_space,bool *inserted_debug_space,bool *inserted_type_space)

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  ostream *poVar4;
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_59;
  string local_58 [36];
  Op local_34;
  bool *pbStack_30;
  Op opcode;
  bool *inserted_type_space_local;
  bool *inserted_debug_space_local;
  bool *inserted_decoration_space_local;
  spv_parsed_instruction_t *inst_local;
  InstructionDisassembler *this_local;
  
  local_34 = (Op)inst->opcode;
  pbStack_30 = inserted_type_space;
  inserted_type_space_local = inserted_debug_space;
  inserted_debug_space_local = inserted_decoration_space;
  inserted_decoration_space_local = (bool *)inst;
  inst_local = (spv_parsed_instruction_t *)this;
  if ((this->comment_ != 0) && (local_34 == OpFunction)) {
    std::ostream::operator<<(this->stream_,std::endl<char,std::char_traits<char>>);
    if ((this->nested_indent_ & 1U) != 0) {
      std::ostream::operator<<(this->stream_,std::endl<char,std::char_traits<char>>);
    }
    poVar4 = this->stream_;
    iVar1 = this->indent_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,(long)iVar1,' ',&local_59);
    std::operator<<(poVar4,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    poVar4 = std::operator<<(this->stream_,"; Function ");
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::operator()(&local_80,&this->name_mapper_,*(uint *)(inserted_decoration_space_local + 0x14));
    poVar4 = std::operator<<(poVar4,(string *)&local_80);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (((this->comment_ != 0) && ((*inserted_debug_space_local & 1U) == 0)) &&
     (bVar2 = spvOpcodeIsDecoration(local_34), bVar2)) {
    *inserted_debug_space_local = true;
    std::ostream::operator<<(this->stream_,std::endl<char,std::char_traits<char>>);
    poVar4 = this->stream_;
    iVar1 = this->indent_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a0,(long)iVar1,' ',&local_a1);
    std::operator<<(poVar4,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    poVar4 = std::operator<<(this->stream_,"; Annotations");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if (((this->comment_ != 0) && ((*inserted_type_space_local & 1U) == 0)) &&
     (bVar2 = spvOpcodeIsDebug(local_34), bVar2)) {
    *inserted_type_space_local = true;
    std::ostream::operator<<(this->stream_,std::endl<char,std::char_traits<char>>);
    poVar4 = this->stream_;
    iVar1 = this->indent_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,(long)iVar1,' ',&local_c9);
    std::operator<<(poVar4,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    poVar4 = std::operator<<(this->stream_,"; Debug Information");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if (((this->comment_ != 0) && ((*pbStack_30 & 1U) == 0)) &&
     (iVar3 = spvOpcodeGeneratesType(local_34), iVar3 != 0)) {
    *pbStack_30 = true;
    std::ostream::operator<<(this->stream_,std::endl<char,std::char_traits<char>>);
    poVar4 = this->stream_;
    iVar1 = this->indent_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f0,(long)iVar1,' ',&local_f1);
    std::operator<<(poVar4,local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    poVar4 = std::operator<<(this->stream_,"; Types, variables and constants");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void InstructionDisassembler::EmitSectionComment(
    const spv_parsed_instruction_t& inst, bool& inserted_decoration_space,
    bool& inserted_debug_space, bool& inserted_type_space) {
  auto opcode = static_cast<spv::Op>(inst.opcode);
  if (comment_ && opcode == spv::Op::OpFunction) {
    stream_ << std::endl;
    if (nested_indent_) {
      // Double the empty lines between Function sections since nested_indent_
      // also separates blocks by a blank.
      stream_ << std::endl;
    }
    stream_ << std::string(indent_, ' ');
    stream_ << "; Function " << name_mapper_(inst.result_id) << std::endl;
  }
  if (comment_ && !inserted_decoration_space && spvOpcodeIsDecoration(opcode)) {
    inserted_decoration_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Annotations" << std::endl;
  }
  if (comment_ && !inserted_debug_space && spvOpcodeIsDebug(opcode)) {
    inserted_debug_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Debug Information" << std::endl;
  }
  if (comment_ && !inserted_type_space && spvOpcodeGeneratesType(opcode)) {
    inserted_type_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Types, variables and constants" << std::endl;
  }
}